

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_heavenly_sceptre_fire(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *victim;
  bool bVar1;
  int iVar2;
  int iVar3;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  victim = ch->fighting;
  bVar1 = is_affected(ch,sn);
  if ((victim != (CHAR_DATA *)0x0 && !bVar1) && (0x1d < ch->level)) {
    iVar2 = dice(0xf,0x14);
    bVar1 = saves_spell((int)ch->level,victim,10);
    iVar3 = iVar2 / 2;
    if (!bVar1) {
      iVar3 = iVar2;
    }
    bVar1 = saves_spell(0x41,victim,0x10);
    iVar2 = iVar3 / 2;
    if (!bVar1) {
      iVar2 = iVar3;
    }
    damage_old(ch,victim,iVar2,sn,10,true);
    bVar1 = is_npc(ch);
    if (!bVar1) {
      iVar3 = number_percent();
      if (ch->level * 2 < iVar3) {
        act("Your sceptre of heavenly orders crumbles to dust.",ch,(void *)0x0,(void *)0x0,0);
        send_to_char("Your sceptre of heavenly orders crumbles to dust.\n\r",ch);
        extract_obj((OBJ_DATA *)0x0);
        return;
      }
      init_affect(&local_90);
      local_90.where = 0;
      local_90.aftype = 0;
      local_90.modifier = 0;
      local_90.duration = 1;
      local_90.location = 0;
      local_90.level = ch->level;
      local_90.type = (short)sn;
      affect_to_char(ch,&local_90);
    }
    return;
  }
  act("$n\'s sceptre hums softly but nothing seems to happen.",ch,(void *)0x0,(void *)0x0,0);
  send_to_char("Your sceptre hums softly but nothing seems to happen.\n\r",ch);
  WAIT_STATE(ch,0xc);
  return;
}

Assistant:

void spell_heavenly_sceptre_fire(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	OBJ_DATA *sceptre = nullptr;
	int dam;
	CHAR_DATA *victim;

	victim = ch->fighting;

	if (is_affected(ch, sn) || victim == nullptr || ch->level < 30)
	{
		act("$n's sceptre hums softly but nothing seems to happen.", ch, 0, 0, TO_ROOM);
		send_to_char("Your sceptre hums softly but nothing seems to happen.\n\r", ch);
		WAIT_STATE(ch, 12);
		return;
	}

	dam = dice(15, 20);

	if (saves_spell(ch->level, victim, DAM_HOLY))
		dam /= 2;

	if (saves_spell(65, victim, DAM_OTHER))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_HOLY, true);

	if (is_npc(ch))
		return;

	if (number_percent() > ch->level * 2)
	{
		act("Your sceptre of heavenly orders crumbles to dust.", ch, 0, 0, TO_ROOM);
		send_to_char("Your sceptre of heavenly orders crumbles to dust.\n\r", ch);
		extract_obj(sceptre);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.modifier = 0;
	af.duration = 1;
	af.location = 0;
	af.level = ch->level;
	affect_to_char(ch, &af);
}